

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O1

bool __thiscall FIX::HttpParser::readHttpMessage(HttpParser *this,string *str)

{
  long lVar1;
  MessageParseError *this_00;
  string local_40;
  
  if (3 < (this->m_buffer)._M_string_length) {
    lVar1 = std::__cxx11::string::find((char *)this,0x1cbf04,0);
    if (0x800 < (this->m_buffer)._M_string_length) {
      this_00 = (MessageParseError *)__cxa_allocate_exception(0x50);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
      MessageParseError::MessageParseError(this_00,&local_40);
      __cxa_throw(this_00,&MessageParseError::typeinfo,FIX::Exception::~Exception);
    }
    if (lVar1 != -1) {
      std::__cxx11::string::assign((string *)str,(ulong)this,0);
      std::__cxx11::string::erase((ulong)this,0);
      return true;
    }
  }
  return false;
}

Assistant:

EXCEPT(MessageParseError) {
  std::string::size_type pos = 0;

  if (m_buffer.length() < 4) {
    return false;
  }
  pos = m_buffer.find("\r\n\r\n");
  if (m_buffer.length() > 2048) {
    throw MessageParseError();
  }
  if (pos == std::string::npos) {
    return false;
  }
  str.assign(m_buffer, 0, pos + 4);
  m_buffer.erase(0, pos + 4);

  return true;
}